

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_vertical_6_dual_sse2
               (uint16_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  uint16_t uVar53;
  uint16_t uVar54;
  uint16_t uVar55;
  uint16_t uVar56;
  uint16_t uVar57;
  uint16_t uVar58;
  uint16_t uVar59;
  uint16_t uVar60;
  uint16_t uVar61;
  uint16_t uVar62;
  uint16_t uVar63;
  uint16_t uVar64;
  uint16_t uVar65;
  uint16_t uVar66;
  uint16_t uVar67;
  uint16_t uVar68;
  uint16_t uVar69;
  uint16_t uVar70;
  uint16_t uVar71;
  uint16_t uVar72;
  undefined1 auVar73 [12];
  undefined1 auVar74 [12];
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined8 uVar97;
  short sVar102;
  short sVar103;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  short sVar104;
  short sVar109;
  short sVar110;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  short sVar111;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  undefined1 auVar112 [16];
  short sVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  short sVar122;
  undefined4 uVar123;
  undefined1 auVar124 [16];
  short sVar128;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  ushort uVar129;
  ushort uVar133;
  ushort uVar134;
  ushort uVar135;
  short sVar136;
  short sVar138;
  ushort uVar140;
  undefined1 auVar130 [16];
  ushort uVar137;
  ushort uVar139;
  ushort uVar141;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  short sVar142;
  short sVar143;
  short sVar144;
  short sVar145;
  short sVar146;
  short sVar147;
  short sVar148;
  short sVar149;
  ushort uVar150;
  ushort uVar155;
  ushort uVar156;
  ushort uVar157;
  short sVar158;
  short sVar160;
  ushort uVar162;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  ushort uVar159;
  ushort uVar161;
  ushort uVar163;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar164 [12];
  short sVar168;
  short sVar169;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  short sVar172;
  ushort uVar173;
  undefined4 uVar174;
  short sVar184;
  ushort uVar186;
  short sVar187;
  ushort uVar189;
  ushort uVar190;
  ushort uVar191;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  ushort uVar185;
  ushort uVar188;
  ushort uVar192;
  undefined1 auVar182 [16];
  short sVar193;
  short sVar200;
  short sVar201;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  short sVar202;
  short sVar208;
  short sVar209;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  ushort uVar220;
  ushort uVar225;
  ushort uVar226;
  ushort uVar227;
  ushort uVar228;
  ushort uVar229;
  ushort uVar230;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  ushort uVar231;
  undefined1 auVar224 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar167 [16];
  undefined1 auVar176 [16];
  undefined1 auVar175 [12];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar183 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  
  auVar98 = *(undefined1 (*) [16])(s + -3);
  puVar1 = s + (long)p + -3;
  uVar53 = *puVar1;
  uVar54 = puVar1[1];
  uVar55 = puVar1[3];
  uVar56 = puVar1[4];
  uVar57 = puVar1[5];
  auVar105 = *(undefined1 (*) [16])(s + (long)(p * 2) + -3);
  puVar2 = s + (long)(p * 3) + -3;
  uVar58 = *puVar2;
  uVar59 = puVar2[1];
  uVar60 = puVar2[3];
  uVar61 = puVar2[4];
  uVar62 = puVar2[5];
  auVar121 = *(undefined1 (*) [16])(s + (long)(p * 4) + -3);
  puVar3 = s + (long)(p * 5) + -3;
  uVar63 = *puVar3;
  uVar64 = puVar3[1];
  uVar65 = puVar3[3];
  uVar66 = puVar3[4];
  uVar67 = puVar3[5];
  auVar127 = *(undefined1 (*) [16])(s + (long)(p * 6) + -3);
  puVar4 = s + (long)(p * 7) + -3;
  uVar68 = *puVar4;
  uVar69 = puVar4[1];
  uVar70 = puVar4[3];
  uVar71 = puVar4[4];
  uVar72 = puVar4[5];
  sVar110 = auVar98._6_2_;
  auVar179._0_12_ = auVar98._0_12_;
  auVar179._12_2_ = sVar110;
  auVar179._14_2_ = uVar55;
  auVar124._12_4_ = auVar179._12_4_;
  auVar124._0_10_ = auVar98._0_10_;
  auVar124._10_2_ = puVar1[2];
  auVar152._10_6_ = auVar124._10_6_;
  auVar152._0_8_ = auVar98._0_8_;
  auVar152._8_2_ = auVar98._4_2_;
  auVar73._4_8_ = auVar152._8_8_;
  auVar73._2_2_ = uVar54;
  sVar109 = auVar98._2_2_;
  auVar73._0_2_ = sVar109;
  sVar104 = auVar98._0_2_;
  auVar165._0_4_ = CONCAT22(uVar53,sVar104);
  auVar165._4_12_ = auVar73;
  sVar187 = auVar105._6_2_;
  auVar178._0_12_ = auVar105._0_12_;
  auVar178._12_2_ = sVar187;
  auVar178._14_2_ = uVar60;
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._0_10_ = auVar105._0_10_;
  auVar177._10_2_ = puVar2[2];
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._0_8_ = auVar105._0_8_;
  auVar176._8_2_ = auVar105._4_2_;
  auVar74._4_8_ = auVar176._8_8_;
  auVar74._2_2_ = uVar59;
  sVar184 = auVar105._2_2_;
  auVar74._0_2_ = sVar184;
  sVar172 = auVar105._0_2_;
  auVar214._6_2_ = uVar58;
  auVar214._4_2_ = sVar172;
  sVar201 = auVar121._6_2_;
  auVar197._0_12_ = auVar121._0_12_;
  auVar197._12_2_ = sVar201;
  auVar197._14_2_ = uVar65;
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._0_10_ = auVar121._0_10_;
  auVar196._10_2_ = puVar3[2];
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._0_8_ = auVar121._0_8_;
  auVar195._8_2_ = auVar121._4_2_;
  auVar75._4_8_ = auVar195._8_8_;
  auVar75._2_2_ = uVar64;
  sVar200 = auVar121._2_2_;
  auVar75._0_2_ = sVar200;
  sVar193 = auVar121._0_2_;
  auVar194._0_4_ = CONCAT22(uVar63,sVar193);
  auVar194._4_12_ = auVar75;
  sVar209 = auVar127._6_2_;
  auVar205._0_12_ = auVar127._0_12_;
  auVar205._12_2_ = sVar209;
  auVar205._14_2_ = uVar70;
  auVar204._12_4_ = auVar205._12_4_;
  auVar204._0_10_ = auVar127._0_10_;
  auVar204._10_2_ = puVar4[2];
  auVar203._10_6_ = auVar204._10_6_;
  auVar203._0_8_ = auVar127._0_8_;
  auVar203._8_2_ = auVar127._4_2_;
  auVar76._4_8_ = auVar203._8_8_;
  auVar76._2_2_ = uVar69;
  sVar208 = auVar127._2_2_;
  auVar76._0_2_ = sVar208;
  sVar202 = auVar127._0_2_;
  auVar214._14_2_ = uVar68;
  auVar214._12_2_ = sVar202;
  auVar221._0_8_ = auVar165._0_8_;
  auVar221._8_4_ = auVar73._0_4_;
  auVar221._12_4_ = auVar74._0_4_;
  auVar214._0_4_ = auVar165._0_4_;
  auVar210._0_8_ = auVar194._0_8_;
  auVar210._8_4_ = auVar75._0_4_;
  auVar210._12_4_ = auVar76._0_4_;
  auVar214._8_4_ = auVar194._0_4_;
  auVar222._8_8_ = auVar210._8_8_;
  auVar222._0_8_ = auVar221._8_8_;
  auVar199._0_8_ = CONCAT44(auVar176._8_4_,auVar152._8_4_);
  auVar199._8_4_ = auVar124._12_4_;
  auVar199._12_4_ = auVar177._12_4_;
  auVar198._0_8_ = CONCAT44(auVar203._8_4_,auVar195._8_4_);
  auVar198._8_4_ = auVar196._12_4_;
  auVar198._12_4_ = auVar204._12_4_;
  auVar112._8_8_ = auVar198._0_8_;
  auVar112._0_8_ = auVar199._0_8_;
  auVar213._8_8_ = auVar198._8_8_;
  auVar213._0_8_ = auVar199._8_8_;
  sVar102 = auVar98._8_2_;
  sVar103 = auVar98._10_2_;
  auVar130._0_8_ = CONCAT26(uVar57,CONCAT24(sVar103,CONCAT22(uVar56,sVar102)));
  sVar136 = auVar105._8_2_;
  sVar138 = auVar105._10_2_;
  auVar130._8_4_ = (int)((ulong)auVar130._0_8_ >> 0x20);
  auVar130._12_4_ = (int)(CONCAT26(uVar62,CONCAT24(sVar138,CONCAT22(uVar61,sVar136))) >> 0x20);
  auVar120._4_4_ = CONCAT22(uVar61,sVar136);
  auVar120._0_4_ = CONCAT22(uVar56,sVar102);
  sVar158 = auVar121._8_2_;
  sVar160 = auVar121._10_2_;
  auVar151._0_8_ = CONCAT26(uVar67,CONCAT24(sVar160,CONCAT22(uVar66,sVar158)));
  sVar168 = auVar127._8_2_;
  sVar169 = auVar127._10_2_;
  auVar151._8_4_ = (int)((ulong)auVar151._0_8_ >> 0x20);
  auVar151._12_4_ = (int)(CONCAT26(uVar72,CONCAT24(sVar169,CONCAT22(uVar71,sVar168))) >> 0x20);
  auVar120._12_4_ = CONCAT22(uVar71,sVar168);
  auVar120._8_4_ = CONCAT22(uVar66,sVar158);
  auVar124 = *(undefined1 (*) [16])_blimit0;
  auVar131 = *(undefined1 (*) [16])_blimit1;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar124._0_13_;
  auVar5[0xe] = auVar124[7];
  auVar11[0xc] = auVar124[6];
  auVar11._0_12_ = auVar124._0_12_;
  auVar11._13_2_ = auVar5._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar124._0_11_;
  auVar17._12_3_ = auVar11._12_3_;
  auVar23[10] = auVar124[5];
  auVar23._0_10_ = auVar124._0_10_;
  auVar23._11_4_ = auVar17._11_4_;
  auVar29[9] = 0;
  auVar29._0_9_ = auVar124._0_9_;
  auVar29._10_5_ = auVar23._10_5_;
  auVar35[8] = auVar124[4];
  auVar35._0_8_ = auVar124._0_8_;
  auVar35._9_6_ = auVar29._9_6_;
  auVar77._7_8_ = 0;
  auVar77._0_7_ = auVar35._8_7_;
  auVar85._1_8_ = SUB158(auVar77 << 0x40,7);
  auVar85[0] = auVar124[3];
  auVar85._9_6_ = 0;
  auVar86._1_10_ = SUB1510(auVar85 << 0x30,5);
  auVar86[0] = auVar124[2];
  auVar86._11_4_ = 0;
  auVar41[2] = auVar124[1];
  auVar41._0_2_ = auVar124._0_2_;
  auVar41._3_12_ = SUB1512(auVar86 << 0x20,3);
  auVar47._2_13_ = auVar41._2_13_;
  auVar47._0_2_ = auVar124._0_2_ & 0xff;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar131._0_13_;
  auVar6[0xe] = auVar131[7];
  auVar12[0xc] = auVar131[6];
  auVar12._0_12_ = auVar131._0_12_;
  auVar12._13_2_ = auVar6._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar131._0_11_;
  auVar18._12_3_ = auVar12._12_3_;
  auVar24[10] = auVar131[5];
  auVar24._0_10_ = auVar131._0_10_;
  auVar24._11_4_ = auVar18._11_4_;
  auVar30[9] = 0;
  auVar30._0_9_ = auVar131._0_9_;
  auVar30._10_5_ = auVar24._10_5_;
  auVar36[8] = auVar131[4];
  auVar36._0_8_ = auVar131._0_8_;
  auVar36._9_6_ = auVar30._9_6_;
  auVar78._7_8_ = 0;
  auVar78._0_7_ = auVar36._8_7_;
  auVar87._1_8_ = SUB158(auVar78 << 0x40,7);
  auVar87[0] = auVar131[3];
  auVar87._9_6_ = 0;
  auVar88._1_10_ = SUB1510(auVar87 << 0x30,5);
  auVar88[0] = auVar131[2];
  auVar88._11_4_ = 0;
  auVar42[2] = auVar131[1];
  auVar42._0_2_ = auVar131._0_2_;
  auVar42._3_12_ = SUB1512(auVar88 << 0x20,3);
  auVar48._2_13_ = auVar42._2_13_;
  auVar48._0_2_ = auVar131._0_2_ & 0xff;
  auVar206._0_8_ = auVar47._0_8_;
  auVar206._8_8_ = auVar48._0_8_;
  auVar165 = ZEXT416(bd - 8);
  auVar207 = psllw(auVar206,auVar165);
  auVar124 = *(undefined1 (*) [16])_limit0;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar124._0_13_;
  auVar7[0xe] = auVar124[7];
  auVar13[0xc] = auVar124[6];
  auVar13._0_12_ = auVar124._0_12_;
  auVar13._13_2_ = auVar7._13_2_;
  auVar19[0xb] = 0;
  auVar19._0_11_ = auVar124._0_11_;
  auVar19._12_3_ = auVar13._12_3_;
  auVar25[10] = auVar124[5];
  auVar25._0_10_ = auVar124._0_10_;
  auVar25._11_4_ = auVar19._11_4_;
  auVar31[9] = 0;
  auVar31._0_9_ = auVar124._0_9_;
  auVar31._10_5_ = auVar25._10_5_;
  auVar37[8] = auVar124[4];
  auVar37._0_8_ = auVar124._0_8_;
  auVar37._9_6_ = auVar31._9_6_;
  auVar79._7_8_ = 0;
  auVar79._0_7_ = auVar37._8_7_;
  auVar89._1_8_ = SUB158(auVar79 << 0x40,7);
  auVar89[0] = auVar124[3];
  auVar89._9_6_ = 0;
  auVar90._1_10_ = SUB1510(auVar89 << 0x30,5);
  auVar90[0] = auVar124[2];
  auVar90._11_4_ = 0;
  auVar43[2] = auVar124[1];
  auVar43._0_2_ = auVar124._0_2_;
  auVar43._3_12_ = SUB1512(auVar90 << 0x20,3);
  auVar49._2_13_ = auVar43._2_13_;
  auVar49._0_2_ = auVar124._0_2_ & 0xff;
  auVar124 = *(undefined1 (*) [16])_limit1;
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar124._0_13_;
  auVar8[0xe] = auVar124[7];
  auVar14[0xc] = auVar124[6];
  auVar14._0_12_ = auVar124._0_12_;
  auVar14._13_2_ = auVar8._13_2_;
  auVar20[0xb] = 0;
  auVar20._0_11_ = auVar124._0_11_;
  auVar20._12_3_ = auVar14._12_3_;
  auVar26[10] = auVar124[5];
  auVar26._0_10_ = auVar124._0_10_;
  auVar26._11_4_ = auVar20._11_4_;
  auVar32[9] = 0;
  auVar32._0_9_ = auVar124._0_9_;
  auVar32._10_5_ = auVar26._10_5_;
  auVar38[8] = auVar124[4];
  auVar38._0_8_ = auVar124._0_8_;
  auVar38._9_6_ = auVar32._9_6_;
  auVar80._7_8_ = 0;
  auVar80._0_7_ = auVar38._8_7_;
  auVar91._1_8_ = SUB158(auVar80 << 0x40,7);
  auVar91[0] = auVar124[3];
  auVar91._9_6_ = 0;
  auVar92._1_10_ = SUB1510(auVar91 << 0x30,5);
  auVar92[0] = auVar124[2];
  auVar92._11_4_ = 0;
  auVar44[2] = auVar124[1];
  auVar44._0_2_ = auVar124._0_2_;
  auVar44._3_12_ = SUB1512(auVar92 << 0x20,3);
  auVar50._2_13_ = auVar44._2_13_;
  auVar50._0_2_ = auVar124._0_2_ & 0xff;
  auVar211._0_8_ = auVar49._0_8_;
  auVar211._8_8_ = auVar50._0_8_;
  auVar212 = psllw(auVar211,auVar165);
  auVar131._8_8_ = auVar151._8_8_;
  auVar131._0_8_ = auVar130._8_8_;
  auVar124 = *(undefined1 (*) [16])_thresh0;
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar124._0_13_;
  auVar9[0xe] = auVar124[7];
  auVar15[0xc] = auVar124[6];
  auVar15._0_12_ = auVar124._0_12_;
  auVar15._13_2_ = auVar9._13_2_;
  auVar21[0xb] = 0;
  auVar21._0_11_ = auVar124._0_11_;
  auVar21._12_3_ = auVar15._12_3_;
  auVar27[10] = auVar124[5];
  auVar27._0_10_ = auVar124._0_10_;
  auVar27._11_4_ = auVar21._11_4_;
  auVar33[9] = 0;
  auVar33._0_9_ = auVar124._0_9_;
  auVar33._10_5_ = auVar27._10_5_;
  auVar39[8] = auVar124[4];
  auVar39._0_8_ = auVar124._0_8_;
  auVar39._9_6_ = auVar33._9_6_;
  auVar81._7_8_ = 0;
  auVar81._0_7_ = auVar39._8_7_;
  auVar93._1_8_ = SUB158(auVar81 << 0x40,7);
  auVar93[0] = auVar124[3];
  auVar93._9_6_ = 0;
  auVar94._1_10_ = SUB1510(auVar93 << 0x30,5);
  auVar94[0] = auVar124[2];
  auVar94._11_4_ = 0;
  auVar45[2] = auVar124[1];
  auVar45._0_2_ = auVar124._0_2_;
  auVar45._3_12_ = SUB1512(auVar94 << 0x20,3);
  auVar51._2_13_ = auVar45._2_13_;
  auVar51._0_2_ = auVar124._0_2_ & 0xff;
  auVar124 = *(undefined1 (*) [16])_thresh1;
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar124._0_13_;
  auVar10[0xe] = auVar124[7];
  auVar16[0xc] = auVar124[6];
  auVar16._0_12_ = auVar124._0_12_;
  auVar16._13_2_ = auVar10._13_2_;
  auVar22[0xb] = 0;
  auVar22._0_11_ = auVar124._0_11_;
  auVar22._12_3_ = auVar16._12_3_;
  auVar28[10] = auVar124[5];
  auVar28._0_10_ = auVar124._0_10_;
  auVar28._11_4_ = auVar22._11_4_;
  auVar34[9] = 0;
  auVar34._0_9_ = auVar124._0_9_;
  auVar34._10_5_ = auVar28._10_5_;
  auVar40[8] = auVar124[4];
  auVar40._0_8_ = auVar124._0_8_;
  auVar40._9_6_ = auVar34._9_6_;
  auVar82._7_8_ = 0;
  auVar82._0_7_ = auVar40._8_7_;
  auVar95._1_8_ = SUB158(auVar82 << 0x40,7);
  auVar95[0] = auVar124[3];
  auVar95._9_6_ = 0;
  auVar96._1_10_ = SUB1510(auVar95 << 0x30,5);
  auVar96[0] = auVar124[2];
  auVar96._11_4_ = 0;
  auVar46[2] = auVar124[1];
  auVar46._0_2_ = auVar124._0_2_;
  auVar46._3_12_ = SUB1512(auVar96 << 0x20,3);
  auVar52._2_13_ = auVar46._2_13_;
  auVar52._0_2_ = auVar124._0_2_ & 0xff;
  auVar170._0_8_ = auVar51._0_8_;
  auVar170._8_8_ = auVar52._0_8_;
  auVar124 = psubusw(auVar214,auVar222);
  auVar152 = psubusw(auVar222,auVar214);
  auVar152 = auVar152 | auVar124;
  auVar124 = psubusw(auVar222,auVar112);
  auVar130 = psubusw(auVar112,auVar222);
  auVar130 = auVar130 | auVar124;
  auVar124 = psubusw(auVar120,auVar213);
  auVar179 = psubusw(auVar213,auVar120);
  auVar179 = auVar179 | auVar124;
  sVar111 = auVar130._0_2_;
  sVar113 = auVar179._0_2_;
  auVar180._0_2_ = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar130._2_2_;
  sVar113 = auVar179._2_2_;
  auVar180._2_2_ = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar130._4_2_;
  sVar113 = auVar179._4_2_;
  auVar180._4_2_ = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar130._6_2_;
  sVar113 = auVar179._6_2_;
  auVar180._6_2_ = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar130._8_2_;
  sVar113 = auVar179._8_2_;
  auVar180._8_2_ = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar130._10_2_;
  sVar113 = auVar179._10_2_;
  auVar180._10_2_ = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar130._12_2_;
  sVar113 = auVar179._12_2_;
  sVar114 = auVar179._14_2_;
  auVar180._12_2_ = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar130._14_2_;
  auVar180._14_2_ = (ushort)(sVar114 < sVar111) * sVar111 | (ushort)(sVar114 >= sVar111) * sVar114;
  auVar130 = psubusw(auVar131,auVar120);
  auVar124 = psubusw(auVar120,auVar131);
  auVar124 = auVar124 | auVar130;
  auVar130 = psubusw(auVar112,auVar213);
  auVar199 = psubusw(auVar213,auVar112);
  auVar179 = psubusw(auVar222,auVar120);
  auVar215 = psubusw(auVar120,auVar222);
  auVar215 = auVar215 | auVar179;
  auVar130 = paddusw(auVar199 | auVar130,auVar199 | auVar130);
  auVar216._0_2_ = auVar215._0_2_ >> 1;
  auVar216._2_2_ = auVar215._2_2_ >> 1;
  auVar216._4_2_ = auVar215._4_2_ >> 1;
  auVar216._6_2_ = auVar215._6_2_ >> 1;
  auVar216._8_2_ = auVar215._8_2_ >> 1;
  auVar216._10_2_ = auVar215._10_2_ >> 1;
  auVar216._12_2_ = auVar215._12_2_ >> 1;
  auVar216._14_2_ = auVar215._14_2_ >> 1;
  auVar130 = paddusw(auVar216,auVar130);
  auVar130 = auVar130 ^ _DAT_004d27e0;
  auVar207 = auVar207 ^ _DAT_004d27e0;
  auVar217._0_2_ = -(ushort)(auVar207._0_2_ < auVar130._0_2_);
  auVar217._2_2_ = -(ushort)(auVar207._2_2_ < auVar130._2_2_);
  auVar217._4_2_ = -(ushort)(auVar207._4_2_ < auVar130._4_2_);
  auVar217._6_2_ = -(ushort)(auVar207._6_2_ < auVar130._6_2_);
  auVar217._8_2_ = -(ushort)(auVar207._8_2_ < auVar130._8_2_);
  auVar217._10_2_ = -(ushort)(auVar207._10_2_ < auVar130._10_2_);
  auVar217._12_2_ = -(ushort)(auVar207._12_2_ < auVar130._12_2_);
  auVar217._14_2_ = -(ushort)(auVar207._14_2_ < auVar130._14_2_);
  auVar130 = paddusw(auVar212,_DAT_0050d400);
  auVar130 = auVar130 & auVar217;
  sVar111 = auVar124._0_2_;
  sVar113 = auVar130._0_2_;
  uVar129 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar124._2_2_;
  sVar113 = auVar130._2_2_;
  uVar133 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar124._4_2_;
  sVar113 = auVar130._4_2_;
  uVar134 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar124._6_2_;
  sVar113 = auVar130._6_2_;
  uVar135 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar124._8_2_;
  sVar113 = auVar130._8_2_;
  uVar137 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar124._10_2_;
  sVar113 = auVar130._10_2_;
  uVar139 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar124._12_2_;
  sVar113 = auVar130._12_2_;
  sVar114 = auVar130._14_2_;
  uVar140 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar124._14_2_;
  uVar141 = (ushort)(sVar114 < sVar111) * sVar111 | (ushort)(sVar114 >= sVar111) * sVar114;
  sVar111 = auVar152._0_2_;
  uVar150 = (sVar111 < (short)auVar180._0_2_) * auVar180._0_2_ |
            (ushort)(sVar111 >= (short)auVar180._0_2_) * sVar111;
  sVar111 = auVar152._2_2_;
  uVar155 = (sVar111 < (short)auVar180._2_2_) * auVar180._2_2_ |
            (ushort)(sVar111 >= (short)auVar180._2_2_) * sVar111;
  sVar111 = auVar152._4_2_;
  uVar156 = (sVar111 < (short)auVar180._4_2_) * auVar180._4_2_ |
            (ushort)(sVar111 >= (short)auVar180._4_2_) * sVar111;
  sVar111 = auVar152._6_2_;
  uVar157 = (sVar111 < (short)auVar180._6_2_) * auVar180._6_2_ |
            (ushort)(sVar111 >= (short)auVar180._6_2_) * sVar111;
  sVar111 = auVar152._8_2_;
  uVar159 = (sVar111 < (short)auVar180._8_2_) * auVar180._8_2_ |
            (ushort)(sVar111 >= (short)auVar180._8_2_) * sVar111;
  sVar111 = auVar152._10_2_;
  uVar161 = (sVar111 < (short)auVar180._10_2_) * auVar180._10_2_ |
            (ushort)(sVar111 >= (short)auVar180._10_2_) * sVar111;
  sVar111 = auVar152._12_2_;
  sVar113 = auVar152._14_2_;
  uVar162 = (sVar111 < (short)auVar180._12_2_) * auVar180._12_2_ |
            (ushort)(sVar111 >= (short)auVar180._12_2_) * sVar111;
  uVar163 = (sVar113 < (short)auVar180._14_2_) * auVar180._14_2_ |
            (ushort)(sVar113 >= (short)auVar180._14_2_) * sVar113;
  auVar153._0_2_ =
       ((short)uVar150 < (short)uVar129) * uVar129 | ((short)uVar150 >= (short)uVar129) * uVar150;
  auVar153._2_2_ =
       ((short)uVar155 < (short)uVar133) * uVar133 | ((short)uVar155 >= (short)uVar133) * uVar155;
  auVar153._4_2_ =
       ((short)uVar156 < (short)uVar134) * uVar134 | ((short)uVar156 >= (short)uVar134) * uVar156;
  auVar153._6_2_ =
       ((short)uVar157 < (short)uVar135) * uVar135 | ((short)uVar157 >= (short)uVar135) * uVar157;
  auVar153._8_2_ =
       ((short)uVar159 < (short)uVar137) * uVar137 | ((short)uVar159 >= (short)uVar137) * uVar159;
  auVar153._10_2_ =
       ((short)uVar161 < (short)uVar139) * uVar139 | ((short)uVar161 >= (short)uVar139) * uVar161;
  auVar153._12_2_ =
       ((short)uVar162 < (short)uVar140) * uVar140 | ((short)uVar162 >= (short)uVar140) * uVar162;
  auVar153._14_2_ =
       ((short)uVar163 < (short)uVar141) * uVar141 | ((short)uVar163 >= (short)uVar141) * uVar163;
  auVar153 = auVar153 ^ _DAT_004d27e0;
  auVar212 = auVar212 ^ _DAT_004d27e0;
  auVar154._0_2_ = -(ushort)(auVar212._0_2_ < auVar153._0_2_);
  auVar154._2_2_ = -(ushort)(auVar212._2_2_ < auVar153._2_2_);
  auVar154._4_2_ = -(ushort)(auVar212._4_2_ < auVar153._4_2_);
  auVar154._6_2_ = -(ushort)(auVar212._6_2_ < auVar153._6_2_);
  auVar154._8_2_ = -(ushort)(auVar212._8_2_ < auVar153._8_2_);
  auVar154._10_2_ = -(ushort)(auVar212._10_2_ < auVar153._10_2_);
  auVar154._12_2_ = -(ushort)(auVar212._12_2_ < auVar153._12_2_);
  auVar154._14_2_ = -(ushort)(auVar212._14_2_ < auVar153._14_2_);
  auVar212 = psllw(_DAT_0050d400,ZEXT416((uint)bd));
  auVar124 = psubusw(auVar131,auVar213);
  auVar131 = psubusw(auVar213,auVar131);
  auVar131 = auVar131 | auVar124;
  auVar124 = psubusw(auVar214,auVar112);
  auVar179 = psubusw(auVar112,auVar214);
  auVar179 = auVar179 | auVar124;
  auVar130 = psllw(auVar170,auVar165);
  sVar111 = auVar131._0_2_;
  sVar113 = auVar179._0_2_;
  uVar129 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar131._2_2_;
  sVar113 = auVar179._2_2_;
  uVar133 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar131._4_2_;
  sVar113 = auVar179._4_2_;
  uVar134 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar131._6_2_;
  sVar113 = auVar179._6_2_;
  uVar135 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar131._8_2_;
  sVar113 = auVar179._8_2_;
  uVar137 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar131._10_2_;
  sVar113 = auVar179._10_2_;
  uVar139 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar131._12_2_;
  sVar113 = auVar179._12_2_;
  sVar114 = auVar179._14_2_;
  uVar140 = (ushort)(sVar113 < sVar111) * sVar111 | (ushort)(sVar113 >= sVar111) * sVar113;
  sVar111 = auVar131._14_2_;
  uVar141 = (ushort)(sVar114 < sVar111) * sVar111 | (ushort)(sVar114 >= sVar111) * sVar114;
  auVar124 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar124 = pshuflw(auVar124,auVar124,0);
  uVar123 = auVar124._0_4_;
  auVar132._4_4_ = uVar123;
  auVar132._0_4_ = uVar123;
  auVar132._8_4_ = uVar123;
  auVar132._12_4_ = uVar123;
  auVar199 = psllw(_DAT_0050d400,auVar165);
  auVar165 = psubsw(auVar112,auVar132);
  auVar218._0_2_ =
       ((short)uVar129 < (short)auVar180._0_2_) * auVar180._0_2_ |
       ((short)uVar129 >= (short)auVar180._0_2_) * uVar129;
  auVar218._2_2_ =
       ((short)uVar133 < (short)auVar180._2_2_) * auVar180._2_2_ |
       ((short)uVar133 >= (short)auVar180._2_2_) * uVar133;
  auVar218._4_2_ =
       ((short)uVar134 < (short)auVar180._4_2_) * auVar180._4_2_ |
       ((short)uVar134 >= (short)auVar180._4_2_) * uVar134;
  auVar218._6_2_ =
       ((short)uVar135 < (short)auVar180._6_2_) * auVar180._6_2_ |
       ((short)uVar135 >= (short)auVar180._6_2_) * uVar135;
  auVar218._8_2_ =
       ((short)uVar137 < (short)auVar180._8_2_) * auVar180._8_2_ |
       ((short)uVar137 >= (short)auVar180._8_2_) * uVar137;
  auVar218._10_2_ =
       ((short)uVar139 < (short)auVar180._10_2_) * auVar180._10_2_ |
       ((short)uVar139 >= (short)auVar180._10_2_) * uVar139;
  auVar218._12_2_ =
       ((short)uVar140 < (short)auVar180._12_2_) * auVar180._12_2_ |
       ((short)uVar140 >= (short)auVar180._12_2_) * uVar140;
  auVar218._14_2_ =
       ((short)uVar141 < (short)auVar180._14_2_) * auVar180._14_2_ |
       ((short)uVar141 >= (short)auVar180._14_2_) * uVar141;
  auVar180 = auVar180 ^ _DAT_004d27e0;
  auVar130 = auVar130 ^ _DAT_004d27e0;
  auVar181._0_2_ = -(ushort)(auVar130._0_2_ < auVar180._0_2_);
  auVar181._2_2_ = -(ushort)(auVar130._2_2_ < auVar180._2_2_);
  auVar181._4_2_ = -(ushort)(auVar130._4_2_ < auVar180._4_2_);
  auVar181._6_2_ = -(ushort)(auVar130._6_2_ < auVar180._6_2_);
  auVar181._8_2_ = -(ushort)(auVar130._8_2_ < auVar180._8_2_);
  auVar181._10_2_ = -(ushort)(auVar130._10_2_ < auVar180._10_2_);
  auVar181._12_2_ = -(ushort)(auVar130._12_2_ < auVar180._12_2_);
  auVar181._14_2_ = -(ushort)(auVar130._14_2_ < auVar180._14_2_);
  auVar124 = psubsw(auVar222,auVar132);
  auVar179 = psubsw(auVar213,auVar132);
  auVar152 = psubsw(auVar120,auVar132);
  auVar207._8_4_ = 0xffffffff;
  auVar207._0_8_ = 0xffffffffffffffff;
  auVar207._12_4_ = 0xffffffff;
  auVar131 = paddsw(auVar212,auVar207);
  auVar213 = psubsw(auVar131,auVar132);
  auVar130 = psubsw((undefined1  [16])0x0,auVar132);
  auVar131 = psubsw(auVar124,auVar152);
  sVar142 = auVar213._0_2_;
  sVar111 = auVar131._0_2_;
  uVar129 = (ushort)(sVar142 < sVar111) * sVar142 | (ushort)(sVar142 >= sVar111) * sVar111;
  sVar143 = auVar213._2_2_;
  sVar111 = auVar131._2_2_;
  uVar133 = (ushort)(sVar143 < sVar111) * sVar143 | (ushort)(sVar143 >= sVar111) * sVar111;
  sVar144 = auVar213._4_2_;
  sVar111 = auVar131._4_2_;
  uVar134 = (ushort)(sVar144 < sVar111) * sVar144 | (ushort)(sVar144 >= sVar111) * sVar111;
  sVar145 = auVar213._6_2_;
  sVar111 = auVar131._6_2_;
  uVar135 = (ushort)(sVar145 < sVar111) * sVar145 | (ushort)(sVar145 >= sVar111) * sVar111;
  sVar146 = auVar213._8_2_;
  sVar111 = auVar131._8_2_;
  uVar137 = (ushort)(sVar146 < sVar111) * sVar146 | (ushort)(sVar146 >= sVar111) * sVar111;
  sVar147 = auVar213._10_2_;
  sVar111 = auVar131._10_2_;
  uVar139 = (ushort)(sVar147 < sVar111) * sVar147 | (ushort)(sVar147 >= sVar111) * sVar111;
  sVar148 = auVar213._12_2_;
  sVar111 = auVar131._12_2_;
  sVar113 = auVar131._14_2_;
  uVar140 = (ushort)(sVar148 < sVar111) * sVar148 | (ushort)(sVar148 >= sVar111) * sVar111;
  sVar149 = auVar213._14_2_;
  uVar141 = (ushort)(sVar149 < sVar113) * sVar149 | (ushort)(sVar149 >= sVar113) * sVar113;
  sVar111 = auVar130._0_2_;
  auVar212._0_2_ =
       (ushort)((short)uVar129 < sVar111) * sVar111 | ((short)uVar129 >= sVar111) * uVar129;
  sVar113 = auVar130._2_2_;
  auVar212._2_2_ =
       (ushort)((short)uVar133 < sVar113) * sVar113 | ((short)uVar133 >= sVar113) * uVar133;
  sVar114 = auVar130._4_2_;
  auVar212._4_2_ =
       (ushort)((short)uVar134 < sVar114) * sVar114 | ((short)uVar134 >= sVar114) * uVar134;
  sVar115 = auVar130._6_2_;
  auVar212._6_2_ =
       (ushort)((short)uVar135 < sVar115) * sVar115 | ((short)uVar135 >= sVar115) * uVar135;
  sVar116 = auVar130._8_2_;
  auVar212._8_2_ =
       (ushort)((short)uVar137 < sVar116) * sVar116 | ((short)uVar137 >= sVar116) * uVar137;
  sVar117 = auVar130._10_2_;
  auVar212._10_2_ =
       (ushort)((short)uVar139 < sVar117) * sVar117 | ((short)uVar139 >= sVar117) * uVar139;
  sVar118 = auVar130._12_2_;
  auVar212._12_2_ =
       (ushort)((short)uVar140 < sVar118) * sVar118 | ((short)uVar140 >= sVar118) * uVar140;
  sVar119 = auVar130._14_2_;
  auVar212._14_2_ =
       (ushort)((short)uVar141 < sVar119) * sVar119 | ((short)uVar141 >= sVar119) * uVar141;
  auVar130 = psubsw(auVar179,auVar165);
  auVar131 = paddsw(auVar212 & auVar181,auVar130);
  auVar131 = paddsw(auVar131,auVar130);
  auVar131 = paddsw(auVar131,auVar130);
  sVar122 = auVar131._0_2_;
  uVar129 = (ushort)(sVar142 < sVar122) * sVar142 | (ushort)(sVar142 >= sVar122) * sVar122;
  sVar122 = auVar131._2_2_;
  uVar133 = (ushort)(sVar143 < sVar122) * sVar143 | (ushort)(sVar143 >= sVar122) * sVar122;
  sVar122 = auVar131._4_2_;
  uVar134 = (ushort)(sVar144 < sVar122) * sVar144 | (ushort)(sVar144 >= sVar122) * sVar122;
  sVar122 = auVar131._6_2_;
  uVar135 = (ushort)(sVar145 < sVar122) * sVar145 | (ushort)(sVar145 >= sVar122) * sVar122;
  sVar122 = auVar131._8_2_;
  uVar137 = (ushort)(sVar146 < sVar122) * sVar146 | (ushort)(sVar146 >= sVar122) * sVar122;
  sVar122 = auVar131._10_2_;
  uVar139 = (ushort)(sVar147 < sVar122) * sVar147 | (ushort)(sVar147 >= sVar122) * sVar122;
  sVar122 = auVar131._12_2_;
  sVar128 = auVar131._14_2_;
  uVar140 = (ushort)(sVar148 < sVar122) * sVar148 | (ushort)(sVar148 >= sVar122) * sVar122;
  uVar141 = (ushort)(sVar149 < sVar128) * sVar149 | (ushort)(sVar149 >= sVar128) * sVar128;
  auVar215._0_2_ =
       (ushort)((short)uVar129 < sVar111) * sVar111 | ((short)uVar129 >= sVar111) * uVar129;
  auVar215._2_2_ =
       (ushort)((short)uVar133 < sVar113) * sVar113 | ((short)uVar133 >= sVar113) * uVar133;
  auVar215._4_2_ =
       (ushort)((short)uVar134 < sVar114) * sVar114 | ((short)uVar134 >= sVar114) * uVar134;
  auVar215._6_2_ =
       (ushort)((short)uVar135 < sVar115) * sVar115 | ((short)uVar135 >= sVar115) * uVar135;
  auVar215._8_2_ =
       (ushort)((short)uVar137 < sVar116) * sVar116 | ((short)uVar137 >= sVar116) * uVar137;
  auVar215._10_2_ =
       (ushort)((short)uVar139 < sVar117) * sVar117 | ((short)uVar139 >= sVar117) * uVar139;
  auVar215._12_2_ =
       (ushort)((short)uVar140 < sVar118) * sVar118 | ((short)uVar140 >= sVar118) * uVar140;
  auVar215._14_2_ =
       (ushort)((short)uVar141 < sVar119) * sVar119 | ((short)uVar141 >= sVar119) * uVar141;
  auVar218 = auVar218 ^ _DAT_004d27e0;
  auVar199 = auVar199 ^ _DAT_004d27e0;
  auVar219._0_2_ = -(ushort)(auVar199._0_2_ < auVar218._0_2_);
  auVar219._2_2_ = -(ushort)(auVar199._2_2_ < auVar218._2_2_);
  auVar219._4_2_ = -(ushort)(auVar199._4_2_ < auVar218._4_2_);
  auVar219._6_2_ = -(ushort)(auVar199._6_2_ < auVar218._6_2_);
  auVar219._8_2_ = -(ushort)(auVar199._8_2_ < auVar218._8_2_);
  auVar219._10_2_ = -(ushort)(auVar199._10_2_ < auVar218._10_2_);
  auVar219._12_2_ = -(ushort)(auVar199._12_2_ < auVar218._12_2_);
  auVar219._14_2_ = -(ushort)(auVar199._14_2_ < auVar218._14_2_);
  auVar131 = paddsw(_DAT_005015c0,~auVar154 & auVar215);
  auVar130 = paddsw(~auVar154 & auVar215,_DAT_0050d420);
  auVar219 = auVar219 | auVar154;
  sVar122 = auVar130._0_2_;
  uVar129 = (ushort)(sVar142 < sVar122) * sVar142 | (ushort)(sVar142 >= sVar122) * sVar122;
  sVar122 = auVar130._2_2_;
  uVar133 = (ushort)(sVar143 < sVar122) * sVar143 | (ushort)(sVar143 >= sVar122) * sVar122;
  sVar122 = auVar130._4_2_;
  uVar134 = (ushort)(sVar144 < sVar122) * sVar144 | (ushort)(sVar144 >= sVar122) * sVar122;
  sVar122 = auVar130._6_2_;
  uVar135 = (ushort)(sVar145 < sVar122) * sVar145 | (ushort)(sVar145 >= sVar122) * sVar122;
  sVar122 = auVar130._8_2_;
  uVar137 = (ushort)(sVar146 < sVar122) * sVar146 | (ushort)(sVar146 >= sVar122) * sVar122;
  sVar122 = auVar130._10_2_;
  uVar139 = (ushort)(sVar147 < sVar122) * sVar147 | (ushort)(sVar147 >= sVar122) * sVar122;
  sVar122 = auVar130._12_2_;
  sVar128 = auVar130._14_2_;
  uVar140 = (ushort)(sVar148 < sVar122) * sVar148 | (ushort)(sVar148 >= sVar122) * sVar122;
  uVar141 = (ushort)(sVar149 < sVar128) * sVar149 | (ushort)(sVar149 >= sVar128) * sVar128;
  auVar223._0_2_ =
       (ushort)((short)uVar129 < sVar111) * sVar111 | ((short)uVar129 >= sVar111) * uVar129;
  auVar223._2_2_ =
       (ushort)((short)uVar133 < sVar113) * sVar113 | ((short)uVar133 >= sVar113) * uVar133;
  auVar223._4_2_ =
       (ushort)((short)uVar134 < sVar114) * sVar114 | ((short)uVar134 >= sVar114) * uVar134;
  auVar223._6_2_ =
       (ushort)((short)uVar135 < sVar115) * sVar115 | ((short)uVar135 >= sVar115) * uVar135;
  auVar223._8_2_ =
       (ushort)((short)uVar137 < sVar116) * sVar116 | ((short)uVar137 >= sVar116) * uVar137;
  auVar223._10_2_ =
       (ushort)((short)uVar139 < sVar117) * sVar117 | ((short)uVar139 >= sVar117) * uVar139;
  auVar223._12_2_ =
       (ushort)((short)uVar140 < sVar118) * sVar118 | ((short)uVar140 >= sVar118) * uVar140;
  auVar223._14_2_ =
       (ushort)((short)uVar141 < sVar119) * sVar119 | ((short)uVar141 >= sVar119) * uVar141;
  auVar130 = psraw(auVar223,3);
  auVar165 = paddsw(auVar130,auVar165);
  sVar122 = auVar131._0_2_;
  uVar129 = (ushort)(sVar142 < sVar122) * sVar142 | (ushort)(sVar142 >= sVar122) * sVar122;
  sVar122 = auVar131._2_2_;
  uVar133 = (ushort)(sVar143 < sVar122) * sVar143 | (ushort)(sVar143 >= sVar122) * sVar122;
  sVar122 = auVar131._4_2_;
  uVar134 = (ushort)(sVar144 < sVar122) * sVar144 | (ushort)(sVar144 >= sVar122) * sVar122;
  sVar122 = auVar131._6_2_;
  uVar135 = (ushort)(sVar145 < sVar122) * sVar145 | (ushort)(sVar145 >= sVar122) * sVar122;
  sVar122 = auVar131._8_2_;
  uVar137 = (ushort)(sVar146 < sVar122) * sVar146 | (ushort)(sVar146 >= sVar122) * sVar122;
  sVar122 = auVar131._10_2_;
  uVar139 = (ushort)(sVar147 < sVar122) * sVar147 | (ushort)(sVar147 >= sVar122) * sVar122;
  sVar122 = auVar131._12_2_;
  sVar128 = auVar131._14_2_;
  uVar140 = (ushort)(sVar148 < sVar122) * sVar148 | (ushort)(sVar148 >= sVar122) * sVar122;
  uVar141 = (ushort)(sVar149 < sVar128) * sVar149 | (ushort)(sVar149 >= sVar128) * sVar128;
  auVar125._0_2_ =
       (ushort)((short)uVar129 < sVar111) * sVar111 | ((short)uVar129 >= sVar111) * uVar129;
  auVar125._2_2_ =
       (ushort)((short)uVar133 < sVar113) * sVar113 | ((short)uVar133 >= sVar113) * uVar133;
  auVar125._4_2_ =
       (ushort)((short)uVar134 < sVar114) * sVar114 | ((short)uVar134 >= sVar114) * uVar134;
  auVar125._6_2_ =
       (ushort)((short)uVar135 < sVar115) * sVar115 | ((short)uVar135 >= sVar115) * uVar135;
  auVar125._8_2_ =
       (ushort)((short)uVar137 < sVar116) * sVar116 | ((short)uVar137 >= sVar116) * uVar137;
  auVar125._10_2_ =
       (ushort)((short)uVar139 < sVar117) * sVar117 | ((short)uVar139 >= sVar117) * uVar139;
  auVar125._12_2_ =
       (ushort)((short)uVar140 < sVar118) * sVar118 | ((short)uVar140 >= sVar118) * uVar140;
  auVar125._14_2_ =
       (ushort)((short)uVar141 < sVar119) * sVar119 | ((short)uVar141 >= sVar119) * uVar141;
  auVar131 = psraw(auVar125,3);
  auVar130 = psubsw(auVar179,auVar131);
  auVar126._0_2_ = auVar131._0_2_ + 1;
  auVar126._2_2_ = auVar131._2_2_ + 1;
  auVar126._4_2_ = auVar131._4_2_ + 1;
  auVar126._6_2_ = auVar131._6_2_ + 1;
  auVar126._8_2_ = auVar131._8_2_ + 1;
  auVar126._10_2_ = auVar131._10_2_ + 1;
  auVar126._12_2_ = auVar131._12_2_ + 1;
  auVar126._14_2_ = auVar131._14_2_ + 1;
  auVar131 = psraw(auVar126,1);
  auVar179 = psubsw(auVar152,~auVar181 & auVar131);
  auVar124 = paddsw(~auVar181 & auVar131,auVar124);
  sVar122 = auVar130._0_2_;
  uVar129 = (ushort)(sVar142 < sVar122) * sVar142 | (ushort)(sVar142 >= sVar122) * sVar122;
  sVar122 = auVar130._2_2_;
  uVar133 = (ushort)(sVar143 < sVar122) * sVar143 | (ushort)(sVar143 >= sVar122) * sVar122;
  sVar122 = auVar130._4_2_;
  uVar134 = (ushort)(sVar144 < sVar122) * sVar144 | (ushort)(sVar144 >= sVar122) * sVar122;
  sVar122 = auVar130._6_2_;
  uVar135 = (ushort)(sVar145 < sVar122) * sVar145 | (ushort)(sVar145 >= sVar122) * sVar122;
  sVar122 = auVar130._8_2_;
  uVar137 = (ushort)(sVar146 < sVar122) * sVar146 | (ushort)(sVar146 >= sVar122) * sVar122;
  sVar122 = auVar130._10_2_;
  uVar139 = (ushort)(sVar147 < sVar122) * sVar147 | (ushort)(sVar147 >= sVar122) * sVar122;
  sVar122 = auVar130._12_2_;
  sVar128 = auVar130._14_2_;
  uVar140 = (ushort)(sVar148 < sVar122) * sVar148 | (ushort)(sVar148 >= sVar122) * sVar122;
  uVar141 = (ushort)(sVar149 < sVar128) * sVar149 | (ushort)(sVar149 >= sVar128) * sVar128;
  sVar122 = auVar165._0_2_;
  uVar220 = (ushort)(sVar142 < sVar122) * sVar142 | (ushort)(sVar142 >= sVar122) * sVar122;
  sVar122 = auVar165._2_2_;
  uVar225 = (ushort)(sVar143 < sVar122) * sVar143 | (ushort)(sVar143 >= sVar122) * sVar122;
  sVar122 = auVar165._4_2_;
  uVar226 = (ushort)(sVar144 < sVar122) * sVar144 | (ushort)(sVar144 >= sVar122) * sVar122;
  sVar122 = auVar165._6_2_;
  uVar227 = (ushort)(sVar145 < sVar122) * sVar145 | (ushort)(sVar145 >= sVar122) * sVar122;
  sVar122 = auVar165._8_2_;
  uVar228 = (ushort)(sVar146 < sVar122) * sVar146 | (ushort)(sVar146 >= sVar122) * sVar122;
  sVar122 = auVar165._10_2_;
  uVar229 = (ushort)(sVar147 < sVar122) * sVar147 | (ushort)(sVar147 >= sVar122) * sVar122;
  sVar122 = auVar165._12_2_;
  sVar128 = auVar165._14_2_;
  uVar230 = (ushort)(sVar148 < sVar122) * sVar148 | (ushort)(sVar148 >= sVar122) * sVar122;
  uVar231 = (ushort)(sVar149 < sVar128) * sVar149 | (ushort)(sVar149 >= sVar128) * sVar128;
  sVar122 = auVar179._0_2_;
  uVar150 = (ushort)(sVar142 < sVar122) * sVar142 | (ushort)(sVar142 >= sVar122) * sVar122;
  sVar122 = auVar179._2_2_;
  uVar155 = (ushort)(sVar143 < sVar122) * sVar143 | (ushort)(sVar143 >= sVar122) * sVar122;
  sVar122 = auVar179._4_2_;
  uVar156 = (ushort)(sVar144 < sVar122) * sVar144 | (ushort)(sVar144 >= sVar122) * sVar122;
  sVar122 = auVar179._6_2_;
  uVar157 = (ushort)(sVar145 < sVar122) * sVar145 | (ushort)(sVar145 >= sVar122) * sVar122;
  sVar122 = auVar179._8_2_;
  uVar159 = (ushort)(sVar146 < sVar122) * sVar146 | (ushort)(sVar146 >= sVar122) * sVar122;
  sVar122 = auVar179._10_2_;
  uVar161 = (ushort)(sVar147 < sVar122) * sVar147 | (ushort)(sVar147 >= sVar122) * sVar122;
  sVar122 = auVar179._12_2_;
  sVar128 = auVar179._14_2_;
  uVar162 = (ushort)(sVar148 < sVar122) * sVar148 | (ushort)(sVar148 >= sVar122) * sVar122;
  uVar163 = (ushort)(sVar149 < sVar128) * sVar149 | (ushort)(sVar149 >= sVar128) * sVar128;
  sVar122 = auVar124._0_2_;
  uVar173 = (ushort)(sVar142 < sVar122) * sVar142 | (ushort)(sVar142 >= sVar122) * sVar122;
  sVar142 = auVar124._2_2_;
  uVar185 = (ushort)(sVar143 < sVar142) * sVar143 | (ushort)(sVar143 >= sVar142) * sVar142;
  sVar142 = auVar124._4_2_;
  uVar186 = (ushort)(sVar144 < sVar142) * sVar144 | (ushort)(sVar144 >= sVar142) * sVar142;
  sVar142 = auVar124._6_2_;
  uVar188 = (ushort)(sVar145 < sVar142) * sVar145 | (ushort)(sVar145 >= sVar142) * sVar142;
  sVar142 = auVar124._8_2_;
  uVar189 = (ushort)(sVar146 < sVar142) * sVar146 | (ushort)(sVar146 >= sVar142) * sVar142;
  sVar142 = auVar124._10_2_;
  uVar190 = (ushort)(sVar147 < sVar142) * sVar147 | (ushort)(sVar147 >= sVar142) * sVar142;
  sVar142 = auVar124._12_2_;
  sVar143 = auVar124._14_2_;
  uVar191 = (ushort)(sVar148 < sVar142) * sVar148 | (ushort)(sVar148 >= sVar142) * sVar142;
  uVar192 = (ushort)(sVar149 < sVar143) * sVar149 | (ushort)(sVar149 >= sVar143) * sVar143;
  auVar166._0_2_ =
       (ushort)((short)uVar129 < sVar111) * sVar111 | ((short)uVar129 >= sVar111) * uVar129;
  auVar166._2_2_ =
       (ushort)((short)uVar133 < sVar113) * sVar113 | ((short)uVar133 >= sVar113) * uVar133;
  auVar166._4_2_ =
       (ushort)((short)uVar134 < sVar114) * sVar114 | ((short)uVar134 >= sVar114) * uVar134;
  auVar166._6_2_ =
       (ushort)((short)uVar135 < sVar115) * sVar115 | ((short)uVar135 >= sVar115) * uVar135;
  auVar166._8_2_ =
       (ushort)((short)uVar137 < sVar116) * sVar116 | ((short)uVar137 >= sVar116) * uVar137;
  auVar166._10_2_ =
       (ushort)((short)uVar139 < sVar117) * sVar117 | ((short)uVar139 >= sVar117) * uVar139;
  auVar166._12_2_ =
       (ushort)((short)uVar140 < sVar118) * sVar118 | ((short)uVar140 >= sVar118) * uVar140;
  auVar166._14_2_ =
       (ushort)((short)uVar141 < sVar119) * sVar119 | ((short)uVar141 >= sVar119) * uVar141;
  auVar224._0_2_ =
       (ushort)((short)uVar220 < sVar111) * sVar111 | ((short)uVar220 >= sVar111) * uVar220;
  auVar224._2_2_ =
       (ushort)((short)uVar225 < sVar113) * sVar113 | ((short)uVar225 >= sVar113) * uVar225;
  auVar224._4_2_ =
       (ushort)((short)uVar226 < sVar114) * sVar114 | ((short)uVar226 >= sVar114) * uVar226;
  auVar224._6_2_ =
       (ushort)((short)uVar227 < sVar115) * sVar115 | ((short)uVar227 >= sVar115) * uVar227;
  auVar224._8_2_ =
       (ushort)((short)uVar228 < sVar116) * sVar116 | ((short)uVar228 >= sVar116) * uVar228;
  auVar224._10_2_ =
       (ushort)((short)uVar229 < sVar117) * sVar117 | ((short)uVar229 >= sVar117) * uVar229;
  auVar224._12_2_ =
       (ushort)((short)uVar230 < sVar118) * sVar118 | ((short)uVar230 >= sVar118) * uVar230;
  auVar224._14_2_ =
       (ushort)((short)uVar231 < sVar119) * sVar119 | ((short)uVar231 >= sVar119) * uVar231;
  auVar171._0_2_ =
       (ushort)((short)uVar150 < sVar111) * sVar111 | ((short)uVar150 >= sVar111) * uVar150;
  auVar171._2_2_ =
       (ushort)((short)uVar155 < sVar113) * sVar113 | ((short)uVar155 >= sVar113) * uVar155;
  auVar171._4_2_ =
       (ushort)((short)uVar156 < sVar114) * sVar114 | ((short)uVar156 >= sVar114) * uVar156;
  auVar171._6_2_ =
       (ushort)((short)uVar157 < sVar115) * sVar115 | ((short)uVar157 >= sVar115) * uVar157;
  auVar171._8_2_ =
       (ushort)((short)uVar159 < sVar116) * sVar116 | ((short)uVar159 >= sVar116) * uVar159;
  auVar171._10_2_ =
       (ushort)((short)uVar161 < sVar117) * sVar117 | ((short)uVar161 >= sVar117) * uVar161;
  auVar171._12_2_ =
       (ushort)((short)uVar162 < sVar118) * sVar118 | ((short)uVar162 >= sVar118) * uVar162;
  auVar171._14_2_ =
       (ushort)((short)uVar163 < sVar119) * sVar119 | ((short)uVar163 >= sVar119) * uVar163;
  auVar182._0_2_ =
       (ushort)((short)uVar173 < sVar111) * sVar111 | ((short)uVar173 >= sVar111) * uVar173;
  auVar182._2_2_ =
       (ushort)((short)uVar185 < sVar113) * sVar113 | ((short)uVar185 >= sVar113) * uVar185;
  auVar182._4_2_ =
       (ushort)((short)uVar186 < sVar114) * sVar114 | ((short)uVar186 >= sVar114) * uVar186;
  auVar182._6_2_ =
       (ushort)((short)uVar188 < sVar115) * sVar115 | ((short)uVar188 >= sVar115) * uVar188;
  auVar182._8_2_ =
       (ushort)((short)uVar189 < sVar116) * sVar116 | ((short)uVar189 >= sVar116) * uVar189;
  auVar182._10_2_ =
       (ushort)((short)uVar190 < sVar117) * sVar117 | ((short)uVar190 >= sVar117) * uVar190;
  auVar182._12_2_ =
       (ushort)((short)uVar191 < sVar118) * sVar118 | ((short)uVar191 >= sVar118) * uVar191;
  auVar182._14_2_ =
       (ushort)((short)uVar192 < sVar119) * sVar119 | ((short)uVar192 >= sVar119) * uVar192;
  auVar124 = paddsw(auVar166,auVar132);
  auVar179 = paddsw(auVar224,auVar132);
  auVar131 = paddsw(auVar171,auVar132);
  auVar130 = paddsw(auVar182,auVar132);
  if ((ushort)((ushort)(SUB161(auVar219 >> 7,0) & 1) | (ushort)(SUB161(auVar219 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar219 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar219 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar219 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar219 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar219 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar219 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar219 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar219 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar219 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar219 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar219 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar219 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar219 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar219[0xf] >> 7) << 0xf) != 0xffff) {
    sVar142 = auVar98._4_2_ + sVar109;
    sVar143 = puVar1[2] + uVar54;
    sVar144 = auVar105._4_2_ + sVar184;
    sVar145 = puVar2[2] + uVar59;
    sVar146 = auVar121._4_2_ + sVar200;
    sVar147 = puVar3[2] + uVar64;
    sVar148 = auVar127._4_2_ + sVar208;
    sVar149 = puVar4[2] + uVar69;
    sVar111 = sVar142 * 2 + sVar104 + 4;
    sVar113 = sVar143 * 2 + uVar53 + 4;
    sVar114 = sVar144 * 2 + sVar172 + 4;
    sVar115 = sVar145 * 2 + uVar58 + 4;
    sVar116 = sVar146 * 2 + sVar193 + 4;
    sVar117 = sVar147 * 2 + uVar63 + 4;
    sVar118 = sVar148 * 2 + sVar202 + 4;
    sVar119 = sVar149 * 2 + uVar68 + 4;
    auVar127._0_2_ = (ushort)(sVar104 * 2 + sVar110 + sVar111) >> 3;
    auVar127._2_2_ = (ushort)(uVar53 * 2 + uVar55 + sVar113) >> 3;
    auVar127._4_2_ = (ushort)(sVar172 * 2 + sVar187 + sVar114) >> 3;
    auVar127._6_2_ = (ushort)(uVar58 * 2 + uVar60 + sVar115) >> 3;
    auVar127._8_2_ = (ushort)(sVar193 * 2 + sVar201 + sVar116) >> 3;
    auVar127._10_2_ = (ushort)(uVar63 * 2 + uVar65 + sVar117) >> 3;
    auVar127._12_2_ = (ushort)(sVar202 * 2 + sVar209 + sVar118) >> 3;
    auVar127._14_2_ = (ushort)(uVar68 * 2 + uVar70 + sVar119) >> 3;
    uVar129 = sVar110 * 2 + sVar102 + sVar111;
    uVar133 = uVar55 * 2 + uVar56 + sVar113;
    uVar134 = sVar187 * 2 + sVar136 + sVar114;
    uVar135 = uVar60 * 2 + uVar61 + sVar115;
    uVar137 = sVar201 * 2 + sVar158 + sVar116;
    uVar139 = uVar65 * 2 + uVar66 + sVar117;
    uVar140 = sVar209 * 2 + sVar168 + sVar118;
    uVar141 = uVar70 * 2 + uVar71 + sVar119;
    uVar150 = ((sVar102 + sVar103) - (sVar109 + sVar104)) + uVar129;
    uVar155 = ((uVar56 + uVar57) - (uVar54 + uVar53)) + uVar133;
    uVar156 = ((sVar136 + sVar138) - (sVar184 + sVar172)) + uVar134;
    uVar157 = ((uVar61 + uVar62) - (uVar59 + uVar58)) + uVar135;
    uVar159 = ((sVar158 + sVar160) - (sVar200 + sVar193)) + uVar137;
    uVar161 = ((uVar66 + uVar67) - (uVar64 + uVar63)) + uVar139;
    uVar162 = ((sVar168 + sVar169) - (sVar208 + sVar202)) + uVar140;
    uVar163 = ((uVar71 + uVar72) - (uVar69 + uVar68)) + uVar141;
    auVar105._0_2_ = uVar129 >> 3;
    auVar105._2_2_ = uVar133 >> 3;
    auVar105._4_2_ = uVar134 >> 3;
    auVar105._6_2_ = uVar135 >> 3;
    auVar105._8_2_ = uVar137 >> 3;
    auVar105._10_2_ = uVar139 >> 3;
    auVar105._12_2_ = uVar140 >> 3;
    auVar105._14_2_ = uVar141 >> 3;
    auVar121._0_2_ = uVar150 >> 3;
    auVar121._2_2_ = uVar155 >> 3;
    auVar121._4_2_ = uVar156 >> 3;
    auVar121._6_2_ = uVar157 >> 3;
    auVar121._8_2_ = uVar159 >> 3;
    auVar121._10_2_ = uVar161 >> 3;
    auVar121._12_2_ = uVar162 >> 3;
    auVar121._14_2_ = uVar163 >> 3;
    auVar98._0_2_ = (ushort)((sVar103 * 2 - sVar142) + uVar150) >> 3;
    auVar98._2_2_ = (ushort)((uVar57 * 2 - sVar143) + uVar155) >> 3;
    auVar98._4_2_ = (ushort)((sVar138 * 2 - sVar144) + uVar156) >> 3;
    auVar98._6_2_ = (ushort)((uVar62 * 2 - sVar145) + uVar157) >> 3;
    auVar98._8_2_ = (ushort)((sVar160 * 2 - sVar146) + uVar159) >> 3;
    auVar98._10_2_ = (ushort)((uVar67 * 2 - sVar147) + uVar161) >> 3;
    auVar98._12_2_ = (ushort)((sVar169 * 2 - sVar148) + uVar162) >> 3;
    auVar98._14_2_ = (ushort)((uVar72 * 2 - sVar149) + uVar163) >> 3;
    auVar131 = auVar131 & auVar219 | ~auVar219 & auVar98;
    auVar130 = auVar130 & auVar219 | ~auVar219 & auVar127;
    auVar179 = auVar179 & auVar219 | ~auVar219 & auVar105;
    auVar124 = auVar124 & auVar219 | ~auVar219 & auVar121;
  }
  auVar101._0_12_ = auVar130._0_12_;
  auVar101._12_2_ = auVar130._6_2_;
  auVar101._14_2_ = auVar179._6_2_;
  auVar100._12_4_ = auVar101._12_4_;
  auVar100._0_10_ = auVar130._0_10_;
  auVar100._10_2_ = auVar179._4_2_;
  auVar99._10_6_ = auVar100._10_6_;
  auVar99._0_8_ = auVar130._0_8_;
  auVar99._8_2_ = auVar130._4_2_;
  auVar83._4_8_ = auVar99._8_8_;
  auVar83._2_2_ = auVar179._2_2_;
  auVar83._0_2_ = auVar130._2_2_;
  auVar108._0_12_ = auVar124._0_12_;
  auVar108._12_2_ = auVar124._6_2_;
  auVar108._14_2_ = auVar131._6_2_;
  auVar107._12_4_ = auVar108._12_4_;
  auVar107._0_10_ = auVar124._0_10_;
  auVar107._10_2_ = auVar131._4_2_;
  auVar106._10_6_ = auVar107._10_6_;
  auVar106._0_8_ = auVar124._0_8_;
  auVar106._8_2_ = auVar124._4_2_;
  auVar84._4_8_ = auVar106._8_8_;
  auVar84._2_2_ = auVar131._2_2_;
  auVar84._0_2_ = auVar124._2_2_;
  uVar174 = CONCAT22(auVar179._8_2_,auVar130._8_2_);
  auVar175._0_8_ = CONCAT26(auVar179._10_2_,CONCAT24(auVar130._10_2_,uVar174));
  auVar175._8_2_ = auVar130._12_2_;
  auVar175._10_2_ = auVar179._12_2_;
  auVar183._12_2_ = auVar130._14_2_;
  auVar183._0_12_ = auVar175;
  auVar183._14_2_ = auVar179._14_2_;
  uVar123 = CONCAT22(auVar131._8_2_,auVar124._8_2_);
  auVar164._0_8_ = CONCAT26(auVar131._10_2_,CONCAT24(auVar124._10_2_,uVar123));
  auVar164._8_2_ = auVar124._12_2_;
  auVar164._10_2_ = auVar131._12_2_;
  auVar167._12_2_ = auVar124._14_2_;
  auVar167._0_12_ = auVar164;
  auVar167._14_2_ = auVar131._14_2_;
  *(ulong *)(s + -2) =
       CONCAT44(CONCAT22(auVar131._0_2_,auVar124._0_2_),CONCAT22(auVar179._0_2_,auVar130._0_2_));
  *(ulong *)(s + (long)p + -2) = CONCAT44(auVar84._0_4_,auVar83._0_4_);
  *(ulong *)(s + (long)(p * 2) + -2) = CONCAT44(auVar106._8_4_,auVar99._8_4_);
  uVar97 = CONCAT44(auVar107._12_4_,auVar100._12_4_);
  *(undefined8 *)(s + (long)(p * 3) + -2) = uVar97;
  *(ulong *)(s + (long)(p * 4) + -2) = CONCAT44(uVar123,uVar174);
  *(ulong *)(s + (long)(p * 5) + -2) =
       CONCAT44((int)((ulong)auVar164._0_8_ >> 0x20),(int)((ulong)auVar175._0_8_ >> 0x20));
  *(ulong *)(s + (long)(p * 6) + -2) = CONCAT44(auVar164._8_4_,auVar175._8_4_);
  *(ulong *)(s + (long)(p * 7) + -2) = CONCAT44(auVar167._12_4_,auVar183._12_4_);
  return;
}

Assistant:

void aom_highbd_lpf_vertical_6_dual_sse2(
    uint16_t *s, int p, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i p0, q0, p1, q1, p2, q2;

  x0 = _mm_loadu_si128((__m128i *)((s - 3) + 0 * p));
  x1 = _mm_loadu_si128((__m128i *)((s - 3) + 1 * p));
  x2 = _mm_loadu_si128((__m128i *)((s - 3) + 2 * p));
  x3 = _mm_loadu_si128((__m128i *)((s - 3) + 3 * p));
  x4 = _mm_loadu_si128((__m128i *)((s - 3) + 4 * p));
  x5 = _mm_loadu_si128((__m128i *)((s - 3) + 5 * p));
  x6 = _mm_loadu_si128((__m128i *)((s - 3) + 6 * p));
  x7 = _mm_loadu_si128((__m128i *)((s - 3) + 7 * p));

  highbd_transpose8x8_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &p2, &p1,
                           &p0, &q0, &q1, &q2, &d6, &d7);

  highbd_lpf_internal_6_dual_sse2(&p2, &p1, &p0, &q0, &q1, &q2, _blimit0,
                                  _limit0, _thresh0, _blimit1, _limit1,
                                  _thresh1, bd);

  highbd_transpose4x8_8x4_sse2(&p1, &p0, &q0, &q1, &d0, &d1, &d2, &d3, &d4, &d5,
                               &d6, &d7);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
  _mm_storel_epi64((__m128i *)(s - 2 + 4 * p), d4);
  _mm_storel_epi64((__m128i *)(s - 2 + 5 * p), d5);
  _mm_storel_epi64((__m128i *)(s - 2 + 6 * p), d6);
  _mm_storel_epi64((__m128i *)(s - 2 + 7 * p), d7);
}